

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O3

void __thiscall
ON_SubDMeshImpl::ClearFragmentFacePointers(ON_SubDMeshImpl *this,bool bResetSubDWeakPtr)

{
  ON_SubDMeshFragment *pOVar1;
  ON_SubDMeshFragment *pOVar2;
  ON_SubDMeshFragment *fragment;
  undefined3 in_register_00000031;
  
  if (CONCAT31(in_register_00000031,bResetSubDWeakPtr) != 0) {
    std::__weak_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->m_subdimple_wp).super___weak_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>);
  }
  pOVar1 = this->m_first_fragment;
  if (pOVar1 != (ON_SubDMeshFragment *)0x0) {
    pOVar2 = (ON_SubDMeshFragment *)pOVar1->m_face;
    while (pOVar2 != (ON_SubDMeshFragment *)0x0) {
      pOVar1->m_face = (ON_SubDFace *)0x0;
      pOVar1 = pOVar1->m_next_fragment;
      pOVar2 = pOVar1;
    }
  }
  return;
}

Assistant:

void ON_SubDMeshImpl::ClearFragmentFacePointers(
  bool bResetSubDWeakPtr
)
{
  // When the ON_SubDimple that manages the faces referenced by
  // fragment->m_face is deleted, fragment->m_face must be set to zero.
  if (bResetSubDWeakPtr)
    m_subdimple_wp.reset();
  if (nullptr != m_first_fragment && nullptr != m_first_fragment->m_face)
  {
    for (auto fragment = m_first_fragment; nullptr != fragment; fragment = fragment->m_next_fragment)
      fragment->m_face = nullptr;
  }
}